

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void recfield(LexState *ls,ConsControl *cc)

{
  int iVar1;
  int iVar2;
  FuncState *fs;
  int iVar3;
  int iVar4;
  expdesc key;
  expdesc val;
  Value local_60;
  int local_58;
  undefined8 local_50;
  expdesc local_48;
  
  fs = ls->fs;
  iVar1 = fs->freereg;
  if ((ls->t).token == 0x11d) {
    if (0x7ffffffd < cc->nh) {
      errorlimit(fs,0x7ffffffd,"items in a constructor");
    }
    local_60.gc = (GCObject *)str_checkname(ls);
    local_58 = 4;
    local_58 = addk(ls->fs,(TValue *)&local_60,(TValue *)&local_60);
    local_50 = 0xffffffffffffffff;
    local_60.b = 4;
  }
  else {
    yindex(ls,(expdesc *)&local_60);
  }
  cc->nh = cc->nh + 1;
  checknext(ls,0x3d);
  iVar3 = luaK_exp2RK(fs,(expdesc *)&local_60);
  subexpr(ls,&local_48,0);
  iVar2 = (cc->t->u).s.info;
  iVar4 = luaK_exp2RK(fs,&local_48);
  luaK_code(fs,iVar3 << 0x17 | iVar4 << 0xe | iVar2 << 6 | 9,fs->ls->lastline);
  fs->freereg = iVar1;
  return;
}

Assistant:

static void recfield(LexState*ls,struct ConsControl*cc){
FuncState*fs=ls->fs;
int reg=ls->fs->freereg;
expdesc key,val;
int rkkey;
if(ls->t.token==TK_NAME){
luaY_checklimit(fs,cc->nh,(INT_MAX-2),"items in a constructor");
checkname(ls,&key);
}
else
yindex(ls,&key);
cc->nh++;
checknext(ls,'=');
rkkey=luaK_exp2RK(fs,&key);
expr(ls,&val);
luaK_codeABC(fs,OP_SETTABLE,cc->t->u.s.info,rkkey,luaK_exp2RK(fs,&val));
fs->freereg=reg;
}